

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::InputScalarAsWidgetReplacement
               (ImRect *bb,ImGuiID id,char *label,ImGuiDataType data_type,void *data_ptr,
               char *format)

{
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  bool bVar2;
  char *fmt;
  ImGuiInputTextFlags flags;
  ImGuiContext *g;
  double dVar3;
  char data_buf [32];
  char fmt_buf [32];
  char local_88 [40];
  ImVec2 local_60;
  char local_58 [40];
  
  pIVar1 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  SetActiveID(pIVar1->ScalarAsInputTextId,window);
  SetHoveredID(0);
  pIVar1->ActiveIdAllowNavDirFlags = 0xc;
  fmt = ImParseFormatTrimDecorations(format,local_58,0x20);
  if ((uint)data_type < 2) {
    ImFormatString(local_88,0x20,fmt,(ulong)*data_ptr);
  }
  else if ((data_type & 0xfffffffeU) == 2) {
    ImFormatString(local_88,0x20,fmt,*data_ptr);
  }
  else {
    if (data_type == 5) {
      dVar3 = *data_ptr;
    }
    else {
      if (data_type != 4) goto LAB_001479c9;
      dVar3 = (double)*data_ptr;
    }
    ImFormatString(local_88,0x20,fmt,dVar3);
  }
LAB_001479c9:
  ImStrTrimBlanks(local_88);
  flags = 0x11;
  if ((data_type & 0xfffffffeU) == 4) {
    flags = 0x20010;
  }
  local_60.x = (bb->Max).x - (bb->Min).x;
  local_60.y = (bb->Max).y - (bb->Min).y;
  bVar2 = InputTextEx(label,local_88,0x20,&local_60,flags,(ImGuiInputTextCallback)0x0,(void *)0x0);
  if (pIVar1->ScalarAsInputTextId == 0) {
    pIVar1->ScalarAsInputTextId = pIVar1->ActiveId;
    SetHoveredID(id);
  }
  if (bVar2) {
    bVar2 = DataTypeApplyOpFromText
                      (local_88,(pIVar1->InputTextState).InitialText.Data,data_type,data_ptr,
                       (char *)0x0);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::InputScalarAsWidgetReplacement(const ImRect& bb, ImGuiID id, const char* label, ImGuiDataType data_type, void* data_ptr, const char* format)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Our replacement widget will override the focus ID (registered previously to allow for a TAB focus to happen)
    // On the first frame, g.ScalarAsInputTextId == 0, then on subsequent frames it becomes == id
    SetActiveID(g.ScalarAsInputTextId, window);
    SetHoveredID(0);
    g.ActiveIdAllowNavDirFlags = (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);

    char fmt_buf[32];
    char data_buf[32];
    format = ImParseFormatTrimDecorations(format, fmt_buf, IM_ARRAYSIZE(fmt_buf));
    DataTypeFormatString(data_buf, IM_ARRAYSIZE(data_buf), data_type, data_ptr, format);
    ImStrTrimBlanks(data_buf);
    ImGuiInputTextFlags flags = ImGuiInputTextFlags_AutoSelectAll | ((data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double) ? ImGuiInputTextFlags_CharsScientific : ImGuiInputTextFlags_CharsDecimal);
    bool value_changed = InputTextEx(label, data_buf, IM_ARRAYSIZE(data_buf), bb.GetSize(), flags);
    if (g.ScalarAsInputTextId == 0)     // First frame we started displaying the InputText widget
    {
        IM_ASSERT(g.ActiveId == id);    // InputText ID expected to match the Slider ID
        g.ScalarAsInputTextId = g.ActiveId;
        SetHoveredID(id);
    }
    if (value_changed)
        return DataTypeApplyOpFromText(data_buf, g.InputTextState.InitialText.Data, data_type, data_ptr, NULL);
    return false;
}